

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O0

bool __thiscall
siamese::DecoderPacketWindow::GrowWindow(DecoderPacketWindow *this,uint windowElementEnd)

{
  bool bVar1;
  uint elements;
  uint in_ESI;
  long in_RDI;
  DecoderSubwindow *subwindow;
  uint i;
  uint subwindowsNeeded;
  uint subwindowCount;
  DecoderSubwindow *in_stack_ffffffffffffffc8;
  uint local_30;
  
  local_30 = *(uint *)(in_RDI + 0x100);
  elements = in_ESI + 0x47 >> 6;
  if (local_30 < elements) {
    bVar1 = pktalloc::LightVector<siamese::DecoderSubwindow_*,_25U>::SetSize_Copy
                      ((LightVector<siamese::DecoderSubwindow_*,_25U> *)CONCAT44(in_ESI,local_30),
                       elements);
    if (!bVar1) {
      return false;
    }
    for (; local_30 < elements; local_30 = local_30 + 1) {
      in_stack_ffffffffffffffc8 =
           pktalloc::Allocator::Construct<siamese::DecoderSubwindow>
                     ((Allocator *)in_stack_ffffffffffffffc8);
      if (in_stack_ffffffffffffffc8 == (DecoderSubwindow *)0x0) {
        return false;
      }
      *(DecoderSubwindow **)(*(long *)(in_RDI + 0x108) + (long)(int)local_30 * 8) =
           in_stack_ffffffffffffffc8;
    }
  }
  if (*(uint *)(in_RDI + 0x28) < in_ESI) {
    *(uint *)(in_RDI + 0x28) = in_ESI;
  }
  return true;
}

Assistant:

bool DecoderPacketWindow::GrowWindow(const unsigned windowElementEnd)
{
    // Note: Adding a buffer of lane count to create space ahead for snapshots
    // as a subwindow is filled and we need to store its snapshot
    const unsigned subwindowCount   = Subwindows.GetSize();
    const unsigned subwindowsNeeded = (windowElementEnd + kColumnLaneCount + kSubwindowSize - 1) / kSubwindowSize;

    if (subwindowsNeeded > subwindowCount)
    {
        // Note resizing larger will keep old data in the vector
        if (!Subwindows.SetSize_Copy(subwindowsNeeded))
            return false;

        // For each subwindow to initialize:
        for (unsigned i = subwindowCount; i < subwindowsNeeded; ++i)
        {
            DecoderSubwindow* subwindow = TheAllocator->Construct<DecoderSubwindow>();
            if (!subwindow)
                return false; // Out of memory

            Subwindows.GetRef(i) = subwindow;
        }
    }

    // If this element expands the window:
    if (windowElementEnd > Count)
        Count = windowElementEnd;

    return true;
}